

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# npp.cpp
# Opt level: O0

void __thiscall pg::NPPSolver::run(NPPSolver *this)

{
  undefined1 auVar1 [32];
  undefined1 auVar3 [32];
  int *piVar4;
  unsigned_long *puVar5;
  uint64_t *puVar6;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var7;
  _Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *p_Var8;
  undefined4 uVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  deque<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  bitset *this_01;
  size_t sVar13;
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *plVar14;
  reference pplVar15;
  long lVar16;
  reference ppdVar17;
  reference ppbVar18;
  ostream *poVar19;
  bool local_1c5;
  undefined1 local_168 [16];
  undefined1 local_158 [64];
  undefined1 auStack_118 [16];
  reference local_100;
  undefined1 local_f0 [16];
  undefined1 local_e0 [24];
  int sop;
  uint prt;
  undefined1 local_b8 [16];
  undefined1 local_a8 [48];
  undefined1 auStack_78 [16];
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *local_60;
  bitset *local_58 [3];
  deque<unsigned_int,_std::allocator<unsigned_int>_> *local_40;
  value_type local_38;
  NPPSolver *local_30;
  NPPSolver *this_local;
  bitset *local_20;
  char local_11;
  bitset *local_10;
  undefined1 auVar2 [64];
  
  local_30 = this;
  std::vector<bool,_std::allocator<bool>_>::push_back(&this->Phase,true);
  local_38 = &this->outgame;
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::push_back(&this->Supgame,&local_38);
  this_00 = (deque<unsigned_int,_std::allocator<unsigned_int>_> *)operator_new(0x50);
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar1 = auVar2._0_32_;
  auVar3 = auVar2._32_32_;
  p_Var7 = &this_00->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>;
  p_Var8 = &this_00->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)auVar1._0_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)auVar1._8_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)auVar1._16_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)auVar1._24_8_;
  (p_Var8->_M_impl).super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)auVar3._0_8_;
  (p_Var8->_M_impl).super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)auVar3._8_8_;
  (p_Var8->_M_impl).super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)auVar3._16_8_;
  (p_Var8->_M_impl).super__Deque_impl_data._M_finish._M_node = (_Map_pointer)auVar3._24_8_;
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auVar1 = auVar2._16_32_;
  p_Var7 = &this_00->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>;
  (this_00->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)auVar2._0_8_;
  (this_00->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Deque_impl_data._M_map_size = auVar2._8_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)auVar1._0_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_first = (_Elt_pointer)auVar1._8_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_last = (_Elt_pointer)auVar1._16_8_;
  (p_Var7->_M_impl).super__Deque_impl_data._M_start._M_node = (_Map_pointer)auVar1._24_8_;
  (this_00->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)auVar2._48_8_;
  (this_00->super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)auVar2._56_8_;
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque(this_00);
  local_40 = this_00;
  std::
  vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
  ::push_back(&this->Heads,&local_40);
  this_01 = (bitset *)operator_new(0x20);
  sVar13 = Solver::nodecount(&this->super_Solver);
  bitset::bitset(this_01,sVar13);
  local_58[0] = this_01;
  std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::push_back(&this->Exits,local_58);
  plVar14 = (list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             *)operator_new(0x18);
  (plVar14->
  super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)0x0;
  (plVar14->
  super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)0x0;
  (plVar14->
  super__List_base<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  )._M_impl._M_node._M_size = 0;
  std::__cxx11::
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::list(plVar14);
  local_60 = plVar14;
  std::
  vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
  ::push_back(&this->Entries,&local_60);
  pplVar15 = std::
             vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
             ::operator[](&this->Entries,0);
  plVar14 = *pplVar15;
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  auStack_78 = auVar2._48_16_;
  auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  local_b8 = auVar2._0_16_;
  local_a8 = auVar2._16_48_;
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  std::__cxx11::
  list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::push_front(plVar14,(deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque
            ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_b8);
  lVar16 = Solver::nodecount(&this->super_Solver);
  this->pos = (int)lVar16 + -1;
  while (bVar10 = bitset::operator[]((this->super_Solver).disabled,(long)this->pos), bVar10) {
    bitset::operator[]((bitset *)&sop,(size_t)&this->outgame);
    bitset::reference::operator=((reference *)&sop,true);
    this->pos = this->pos + -1;
  }
  uVar11 = Solver::priority(&this->super_Solver,this->pos);
  this->maxprio = uVar11;
  for (local_e0._20_4_ = 0; (uint)local_e0._20_4_ <= this->maxprio;
      local_e0._20_4_ = local_e0._20_4_ + 1) {
    this->inverse[(uint)local_e0._20_4_] = -1;
  }
  for (local_e0._16_4_ = 0; (int)local_e0._16_4_ <= this->pos; local_e0._16_4_ = local_e0._16_4_ + 1
      ) {
    bVar10 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_e0._16_4_);
    uVar9 = local_e0._16_4_;
    if (bVar10) {
      bitset::operator[]((bitset *)local_e0,(size_t)&this->outgame);
      bitset::reference::operator=((reference *)local_e0,true);
    }
    else {
      piVar4 = this->inverse;
      iVar12 = Solver::priority(&this->super_Solver,local_e0._16_4_);
      piVar4[iVar12] = uVar9;
      this->strategy[(int)local_e0._16_4_] = -1;
    }
  }
  while (-1 < this->pos) {
    this->doms = this->doms + 1;
    this->p = this->maxprio;
    this->alpha = this->p & 1;
    (*(this->super_Solver)._vptr_Solver[7])();
    bitset::operator|=(&this->outgame,&this->R);
    if (this->alpha == 0) {
      bitset::operator|=(&this->winzero,&this->R);
    }
    this->pos = this->inverse[this->maxprio];
    while( true ) {
      local_1c5 = false;
      if (-1 < this->pos) {
        bitset::operator[]((bitset *)local_f0,(size_t)&this->outgame);
        local_1c5 = bitset::reference::operator_cast_to_bool((reference *)local_f0);
      }
      if (local_1c5 == false) break;
      this->pos = this->pos + -1;
    }
    if (-1 < this->pos) {
      uVar11 = Solver::priority(&this->super_Solver,this->pos);
      this->maxprio = uVar11;
    }
    this->Pivot = 0;
    this->Top = 0;
    local_100 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->Phase,0);
    std::_Bit_reference::operator=(&local_100,true);
    ppdVar17 = std::
               vector<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_*>_>
               ::operator[](&this->Heads,0);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::clear(*ppdVar17);
    ppbVar18 = std::vector<pg::bitset_*,_std::allocator<pg::bitset_*>_>::operator[](&this->Exits,0);
    local_10 = *ppbVar18;
    puVar5 = local_10->_bits;
    sVar13 = bitset::num_blocks(local_10);
    local_11 = '\0';
    std::fill<unsigned_long*,char>(puVar5,puVar5 + sVar13,&local_11);
    pplVar15 = std::
               vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
               ::operator[](&this->Entries,0);
    std::__cxx11::
    list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::clear(*pplVar15);
    pplVar15 = std::
               vector<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*,_std::allocator<std::__cxx11::list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>_*>_>
               ::operator[](&this->Entries,0);
    plVar14 = *pplVar15;
    auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    auStack_118 = auVar2._48_16_;
    auVar2 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
    local_158._0_16_ = auVar2._0_16_;
    local_158._16_48_ = auVar2._16_48_;
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::deque
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
    std::__cxx11::
    list<std::deque<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::deque<unsigned_int,_std::allocator<unsigned_int>_>_>_>
    ::push_front(plVar14,(deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
    std::deque<unsigned_int,_std::allocator<unsigned_int>_>::~deque
              ((deque<unsigned_int,_std::allocator<unsigned_int>_> *)local_158);
    local_20 = &this->R;
    puVar5 = local_20->_bits;
    puVar6 = local_20->_bits;
    sVar13 = bitset::num_blocks(local_20);
    this_local._7_1_ = 0;
    std::fill<unsigned_long*,char>(puVar5,puVar6 + sVar13,(char *)((long)&this_local + 7));
  }
  this->pos = 0;
  while (iVar12 = this->pos, lVar16 = Solver::nodecount(&this->super_Solver), iVar12 < lVar16) {
    bVar10 = bitset::operator[]((this->super_Solver).disabled,(long)this->pos);
    if (!bVar10) {
      iVar12 = this->pos;
      bitset::operator[]((bitset *)local_168,(size_t)&this->winzero);
      bVar10 = bitset::reference::operator_cast_to_bool((reference *)local_168);
      Solver::solve(&this->super_Solver,iVar12,(uint)((bVar10 ^ 0xffU) & 1),
                    this->strategy[this->pos]);
    }
    this->pos = this->pos + 1;
  }
  poVar19 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->totqueries);
  poVar19 = std::operator<<(poVar19," total queries and ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->totpromos);
  poVar19 = std::operator<<(poVar19," total promotions;");
  std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
  poVar19 = std::operator<<((this->super_Solver).logger,"            ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->maxqueries);
  poVar19 = std::operator<<(poVar19," max queries and ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->maxpromos);
  poVar19 = std::operator<<(poVar19," max promotions;");
  std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
  poVar19 = std::operator<<((this->super_Solver).logger,"            ");
  poVar19 = (ostream *)std::ostream::operator<<(poVar19,this->doms);
  poVar19 = std::operator<<(poVar19," dominions.");
  std::ostream::operator<<(poVar19,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void NPPSolver::run()
{

    /* vv Stack initialization vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    Phase.push_back(true);
    Supgame.push_back(&outgame);
    Heads.push_back(new uideque());
    Exits.push_back(new bitset(nodecount()));
    Entries.push_back(new uidlist());
    Entries[0]->push_front(uideque());
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Initialization of pos and maxprio vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    for (pos = nodecount() - 1;; --pos)
    {
        if (disabled[pos])
        {
            outgame[pos] = true;
        }
        else
        {
            maxprio = priority(pos);
            break;
        }
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Initialization of inverse, outgame, and strategy vvvvvvvvvvvvvvvvvvvv */
    for (uint prt = 0; prt <= maxprio; ++prt)
    {
        inverse[prt] = -1;
    }
    for (int sop = 0; sop <= pos; sop++)
    {
        if (disabled[sop])
        {
            outgame[sop] = true;
        }
        else
        {
            inverse[priority(sop)] = sop;
            strategy[sop] = -1;
        }
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Main solution cycle vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    while (pos >= 0)
    {

        /* vv Update of the statistic on the number of dominions vvvvvvvvvvvvvvvv */
        doms++;
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Setting of the initial priority and parity vvvvvvvvvvvvvvvvvvvvvvvv */
        p = maxprio;
        alpha = p & 1;
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Call to the search routine and update of the zero winning region vv */
        search();
        outgame |= R;
        if (alpha == 0)
        {
            winzero |= R;
        }
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Search for the new pos and maxprio vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
        for (pos = inverse[maxprio]; pos >= 0 && outgame[pos]; --pos)
        {
        }
        if (pos >= 0) maxprio = priority(pos);
        /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

        /* vv Stack and current region cleaning vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
        Top = Pivot = 0;
        Phase[0] = true;
        Heads[0]->clear();
        Exits[0]->reset();
        Entries[0]->clear();
        Entries[0]->push_front(uideque());
        R.reset();
        // /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Setting of the final solution vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    for (pos = 0; pos < nodecount(); ++pos)
    {
        if (disabled[pos]) continue;
        Solver::solve(pos, !winzero[pos], strategy[pos]);
    }
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */

    /* vv Printing of statistics vvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvvv */
    logger << "solved with " << totqueries << " total queries and " << totpromos << " total promotions;" << std::endl;
    logger << "            " << maxqueries << " max queries and " << maxpromos << " max promotions;" << std::endl;
    logger << "            " << doms << " dominions." << std::endl;
    /* ^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^^ */
}